

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_conversions.h
# Opt level: O0

conversion_result mjs::unicode::utf16_to_utf32<wchar_t>(wchar_t *src,uint max_length)

{
  wchar_t wVar1;
  char16_t lead;
  ushort uVar2;
  uint uVar3;
  char16_t second_code_unit;
  uint l;
  char16_t first_code_unit;
  uint max_length_local;
  wchar_t *src_local;
  
  if (max_length == 0) {
    __assert_fail("max_length != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/char_conversions.h"
                  ,0x78,
                  "conversion_result mjs::unicode::utf16_to_utf32(const CharT *, unsigned int) [CharT = wchar_t]"
                 );
  }
  wVar1 = *src;
  lead = (char16_t)wVar1;
  uVar3 = utf16_length_from_lead_code_unit(lead);
  if (uVar3 == 0) {
    src_local = (wchar_t *)0x0;
  }
  else if (max_length < uVar3) {
    src_local = (wchar_t *)0x0;
  }
  else if (uVar3 == 1) {
    src_local = (wchar_t *)(CONCAT44(wVar1,1) & 0xffffffffffff);
  }
  else {
    if ((ushort)lead < 0xd800 || 0xdbff < (ushort)lead) {
      __assert_fail("first_code_unit >= utf16_high_surrogate && first_code_unit < utf16_low_surrogate"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/char_conversions.h"
                    ,0x85,
                    "conversion_result mjs::unicode::utf16_to_utf32(const CharT *, unsigned int) [CharT = wchar_t]"
                   );
    }
    uVar2 = (ushort)src[1];
    if ((uVar2 < 0xdc00) || (0xdfff < uVar2)) {
      src_local = (wchar_t *)0x0;
    }
    else {
      src_local = (wchar_t *)
                  CONCAT44(((wVar1 & 0xffffU) - 0xd800U) * 0x400 + (src[1] & 0xffffU) + 0x2400U,2);
    }
  }
  return (conversion_result)src_local;
}

Assistant:

constexpr conversion_result utf16_to_utf32(const CharT* src, unsigned max_length) {
    static_assert(sizeof(CharT) >= sizeof(char16_t));
    assert(max_length != 0);
    const auto first_code_unit = static_cast<char16_t>(src[0]);
    const auto l = utf16_length_from_lead_code_unit(first_code_unit);
    if (!l) {
        // Invalid leading byte
        return invalid_conversion;
    } else if (l > max_length) {
        // Not enough source characters
        return invalid_conversion;
    } else if (l == 1) {
        // Simple case
        return { 1, first_code_unit };
    }
    assert(first_code_unit >= utf16_high_surrogate && first_code_unit < utf16_low_surrogate);
    const auto second_code_unit = static_cast<char16_t>(src[1]);
    if (second_code_unit < utf16_low_surrogate || second_code_unit > utf16_last_surrogate) {
        // Invalid surrogate pair
        return invalid_conversion;
    }

    return { 2, static_cast<char32_t>(0x10000 + ((first_code_unit - utf16_high_surrogate) << 10) + (second_code_unit - utf16_low_surrogate)) };
}